

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O2

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::insert
          (BinaryHeap<Liby::WeakTimerHolder> *this,const_reference_type x)

{
  vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_> *this_00;
  bool bVar1;
  long lVar2;
  pointer pWVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = this->size_;
  this_00 = &this->heap;
  lVar2 = ((long)(this->heap).
                 super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).
                super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x48;
  if (lVar2 - 1U == (ulong)uVar4) {
    std::vector<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>::resize
              (this_00,lVar2 * 2);
    uVar4 = this->size_;
  }
  this->size_ = uVar4 + 1;
  uVar5 = (ulong)(uVar4 + 1);
  while( true ) {
    pWVar3 = (this_00->
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((uint)uVar5 < 2) break;
    uVar6 = (ulong)((uint)uVar5 >> 1);
    bVar1 = operator<(x,pWVar3 + uVar6);
    pWVar3 = (this_00->
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (!bVar1) break;
    WeakTimerHolder::operator=(pWVar3 + uVar5,pWVar3 + uVar6);
    uVar5 = uVar6;
  }
  WeakTimerHolder::operator=(pWVar3 + uVar5,x);
  return;
}

Assistant:

void insert(const_reference_type x) {
        if (size_ == heap.size() - 1)
            heap.resize(heap.size() * 2);

        size_type hole = ++size_;
        for (; hole > 1 && x < heap[hole / 2]; hole /= 2)
            heap[hole] = heap[hole / 2];
        heap[hole] = x;
    }